

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framing.c
# Opt level: O0

char * ogg_sync_buffer(ogg_sync_state *oy,long size)

{
  int iVar1;
  size_t __size;
  uchar *local_30;
  void *ret;
  long newsize;
  long size_local;
  ogg_sync_state *oy_local;
  
  iVar1 = ogg_sync_check(oy);
  if (iVar1 != 0) {
    return (char *)0x0;
  }
  if (oy->returned != 0) {
    oy->fill = oy->fill - oy->returned;
    if (0 < oy->fill) {
      memmove(oy->data,oy->data + oy->returned,(long)oy->fill);
    }
    oy->returned = 0;
  }
  if (oy->storage - oy->fill < size) {
    if (0x7fffefff - oy->fill < size) {
      ogg_sync_clear(oy);
      return (char *)0x0;
    }
    __size = size + oy->fill + 0x1000;
    if (oy->data == (uchar *)0x0) {
      local_30 = (uchar *)malloc(__size);
    }
    else {
      local_30 = (uchar *)realloc(oy->data,__size);
    }
    if (local_30 == (uchar *)0x0) {
      ogg_sync_clear(oy);
      return (char *)0x0;
    }
    oy->data = local_30;
    oy->storage = (int)__size;
  }
  return (char *)(oy->data + oy->fill);
}

Assistant:

char *ogg_sync_buffer(ogg_sync_state *oy, long size){
  if(ogg_sync_check(oy)) return NULL;

  /* first, clear out any space that has been previously returned */
  if(oy->returned){
    oy->fill-=oy->returned;
    if(oy->fill>0)
      memmove(oy->data,oy->data+oy->returned,oy->fill);
    oy->returned=0;
  }

  if(size>oy->storage-oy->fill){
    /* We need to extend the internal buffer */
    long newsize;
    void *ret;

    if(size>INT_MAX-4096-oy->fill){
      ogg_sync_clear(oy);
      return NULL;
    }
    newsize=size+oy->fill+4096; /* an extra page to be nice */
    if(oy->data)
      ret=_ogg_realloc(oy->data,newsize);
    else
      ret=_ogg_malloc(newsize);
    if(!ret){
      ogg_sync_clear(oy);
      return NULL;
    }
    oy->data=ret;
    oy->storage=newsize;
  }

  /* expose a segment at least as large as requested at the fill mark */
  return((char *)oy->data+oy->fill);
}